

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Abc_Cex_t * Bmc_CexInnerStates(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t **ppCexImpl,int fVerbose)

{
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Abc_Cex_t *pCex_00;
  Abc_Cex_t *pCex_01;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_64;
  int local_60;
  int iBit;
  int k;
  int i;
  int fCompl1;
  int fCompl0;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pNew2;
  Abc_Cex_t *pNew;
  int fVerbose_local;
  Abc_Cex_t **ppCexImpl_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x18a,
                  "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
  }
  iVar3 = Gia_ManCiNum(p);
  pCex_00 = Abc_CexAlloc(0,iVar3,pCex->iFrame + 1);
  pCex_00->iFrame = pCex->iFrame;
  pCex_00->iPo = pCex->iPo;
  iVar3 = Gia_ManCiNum(p);
  pCex_01 = Abc_CexAlloc(0,iVar3,pCex->iFrame + 1);
  pCex_01->iFrame = pCex->iFrame;
  pCex_01->iPo = pCex->iPo;
  Gia_ManCleanMark01(p);
  pGVar6 = Gia_ManConst0(p);
  *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xffffffffbfffffff;
  pGVar6 = Gia_ManConst0(p);
  *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xbfffffffffffffff | 0x4000000000000000;
  local_60 = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(p);
    bVar7 = false;
    if (local_60 < iVar3) {
      iVar3 = Gia_ManPoNum(p);
      _fCompl1 = Gia_ManCo(p,iVar3 + local_60);
      bVar7 = _fCompl1 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    *(ulong *)_fCompl1 = *(ulong *)_fCompl1 & 0xffffffffbfffffff;
    *(ulong *)_fCompl1 = *(ulong *)_fCompl1 & 0xbfffffffffffffff | 0x4000000000000000;
    local_60 = local_60 + 1;
  }
  local_64 = pCex->nRegs;
  for (iBit = 0; iBit <= pCex->iFrame; iBit = iBit + 1) {
    local_60 = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(p);
      bVar7 = false;
      if (local_60 < iVar3) {
        pObjRo = Gia_ManCi(p,local_60);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),local_64);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)uVar5 & 1) << 0x1e;
      local_60 = local_60 + 1;
      local_64 = local_64 + 1;
    }
    local_60 = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(p);
      bVar7 = false;
      if (local_60 < iVar3) {
        iVar3 = Gia_ManPoNum(p);
        _fCompl1 = Gia_ManCo(p,iVar3 + local_60);
        bVar7 = false;
        if (_fCompl1 != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar3 + local_60);
          bVar7 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xffffffffbfffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x1e) & 1) << 0x1e;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xbfffffffffffffff |
           (ulong)((uint)(*(ulong *)_fCompl1 >> 0x3e) & 1) << 0x3e;
      local_60 = local_60 + 1;
    }
    local_60 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCis);
      bVar7 = false;
      if (local_60 < iVar3) {
        pObjRo = Gia_ManCi(p,local_60);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if ((*(ulong *)pObjRo >> 0x1e & 1) != 0) {
        Abc_InfoSetBit((uint *)(pCex_00 + 1),pCex_00->nPis * iBit + local_60);
      }
      if ((*(ulong *)pObjRo >> 0x3e & 1) != 0) {
        Abc_InfoSetBit((uint *)(pCex_01 + 1),pCex_01->nPis * iBit + local_60);
      }
      local_60 = local_60 + 1;
    }
    local_60 = 0;
    while( true ) {
      bVar7 = false;
      if (local_60 < p->nObjs) {
        pObjRo = Gia_ManObj(p,local_60);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(ulong *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        uVar5 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar5;
        pGVar6 = Gia_ObjFanin1(pObjRo);
        uVar2 = *(ulong *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        uVar4 = (uint)(uVar2 >> 0x1e) & 1 ^ uVar4;
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xffffffffbfffffff | ((ulong)(uVar5 & uVar4) & 1) << 0x1e;
        if ((*(ulong *)pObjRo >> 0x1e & 1) == 0) {
          if ((uVar5 == 0) && (uVar4 == 0)) {
            pGVar6 = Gia_ObjFanin0(pObjRo);
            uVar1 = *(undefined8 *)pGVar6;
            pGVar6 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 |
                        (uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1) << 0x3e;
          }
          else if (uVar5 == 0) {
            pGVar6 = Gia_ObjFanin0(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1) << 0x3e;
          }
          else {
            if (uVar4 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                            ,0x1bc,
                            "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)"
                           );
            }
            pGVar6 = Gia_ObjFanin1(pObjRo);
            *(ulong *)pObjRo =
                 *(ulong *)pObjRo & 0xbfffffffffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1) << 0x3e;
          }
        }
        else {
          pGVar6 = Gia_ObjFanin0(pObjRo);
          uVar1 = *(undefined8 *)pGVar6;
          pGVar6 = Gia_ObjFanin1(pObjRo);
          *(ulong *)pObjRo =
               *(ulong *)pObjRo & 0xbfffffffffffffff |
               (ulong)((uint)((ulong)uVar1 >> 0x3e) & 1 &
                      (uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1) << 0x3e;
        }
      }
      local_60 = local_60 + 1;
    }
    local_60 = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (local_60 < iVar3) {
        pObjRo = Gia_ManCo(p,local_60);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(ulong *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff |
           ((ulong)((uint)(uVar2 >> 0x1e) & 1 ^ uVar5) & 1) << 0x1e;
      pGVar6 = Gia_ObjFanin0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x3e) & 1) << 0x3e;
      local_60 = local_60 + 1;
    }
  }
  if (local_64 == pCex->nBits) {
    pGVar6 = Gia_ManPo(p,pCex->iPo);
    if (((uint)(*(ulong *)pGVar6 >> 0x1e) & 1) != 1) {
      __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                    ,0x1d3,
                    "Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)");
    }
    printf("Inner states: ");
    iVar3 = Gia_ManPiNum(p);
    Bmc_CexPrint(pCex_00,iVar3,fVerbose);
    printf("Implications: ");
    iVar3 = Gia_ManPiNum(p);
    Bmc_CexPrint(pCex_01,iVar3,fVerbose);
    if (ppCexImpl == (Abc_Cex_t **)0x0) {
      Abc_CexFree(pCex_01);
    }
    else {
      *ppCexImpl = pCex_01;
    }
    return pCex_00;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                ,0x1d2,"Abc_Cex_t *Bmc_CexInnerStates(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t **, int)")
  ;
}

Assistant:

Abc_Cex_t * Bmc_CexInnerStates( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t ** ppCexImpl, int fVerbose )
{
    Abc_Cex_t * pNew, * pNew2;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // start the counter-example
    pNew2 = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew2->iFrame = pCex->iFrame;
    pNew2->iPo    = pCex->iPo;
    // set initial state
    Gia_ManCleanMark01(p);
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManConst0(p)->fMark1 = 1;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
    {
        pObjRi->fMark0 = 0;
        pObjRi->fMark1 = 1;
    }
    iBit = pCex->nRegs;
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
        }
        Gia_ManForEachCi( p, pObj, k )
        {
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
            if ( pObj->fMark1 )
                Abc_InfoSetBit( pNew2->pData, pNew2->nPis * i + k );
        }
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
        }

/*
        // print input/state/output
        printf( "%3d : ", i );
        Gia_ManForEachPi( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachRo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( " " );
        Gia_ManForEachPo( p, pObj, k )
            printf( "%d", pObj->fMark0 );
        printf( "\n" );
*/
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );

    printf( "Inner states: " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    printf( "Implications: " );
    Bmc_CexPrint( pNew2, Gia_ManPiNum(p), fVerbose );
    if ( ppCexImpl )
        *ppCexImpl = pNew2;
    else
        Abc_CexFree( pNew2 );
    return pNew;
}